

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# respond.c
# Opt level: O0

void resp0_sock_fini(void *arg)

{
  resp0_sock *s;
  void *arg_local;
  
  nni_id_map_fini((nni_id_map *)((long)arg + 0x30));
  resp0_ctx_fini((void *)((long)arg + 0x68));
  nni_pollable_fini((nni_pollable *)((long)arg + 0x138));
  nni_pollable_fini((nni_pollable *)((long)arg + 0x128));
  nni_mtx_fini((nni_mtx *)arg);
  return;
}

Assistant:

static void
resp0_sock_fini(void *arg)
{
	resp0_sock *s = arg;

	nni_id_map_fini(&s->pipes);
	resp0_ctx_fini(&s->ctx);
	nni_pollable_fini(&s->writable);
	nni_pollable_fini(&s->readable);
	nni_mtx_fini(&s->mtx);
}